

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_sound.cpp
# Opt level: O2

void Cmd_listsoundchannels(FCommandLine *argv,APlayerPawn *who,int key)

{
  FSoundChan *chan;
  long lVar1;
  uint uVar2;
  char *pcVar3;
  FSoundChan **ppFVar4;
  FVector3 chanorigin;
  FVector3 local_34;
  
  uVar2 = 0;
  ppFVar4 = &Channels;
  while (chan = *ppFVar4, chan != (FSoundChan *)0x0) {
    if ((chan->ChanFlags & 2) == 0) {
      CalcPosVel(chan,&local_34,(FVector3 *)0x0);
      lVar1 = (long)(chan->SoundID).ID;
      pcVar3 = (char *)0x0;
      if (lVar1 != 0) {
        pcVar3 = S_sfx.Array[lVar1].name.Chars;
      }
      Printf("%s at (%1.5f, %1.5f, %1.5f)\n",(double)local_34.X,(double)local_34.Y,
             (double)local_34.Z,pcVar3);
      uVar2 = uVar2 + 1;
    }
    ppFVar4 = &chan->NextChan;
  }
  Printf("%d sounds playing\n",(ulong)uVar2);
  return;
}

Assistant:

CCMD(listsoundchannels)
{	
	FSoundChan *chan;
	int count = 0;
	for (chan = Channels; chan != NULL; chan = chan->NextChan)
	{
		if (!(chan->ChanFlags & CHAN_EVICTED))
		{
			FVector3 chanorigin;

			CalcPosVel(chan, &chanorigin, NULL);

			Printf("%s at (%1.5f, %1.5f, %1.5f)\n", (const char*)chan->SoundID, chanorigin.X, chanorigin.Y, chanorigin.Z);
			count++;
		}
	}
	Printf("%d sounds playing\n", count);
}